

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O1

uint __thiscall dg::pta::PSNoopRemover::run(PSNoopRemover *this)

{
  undefined8 *puVar1;
  char *__filename;
  PointerGraph *this_00;
  uint uVar2;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *nd;
  undefined8 *puVar3;
  
  puVar1 = *(undefined8 **)(*(long *)this + 0x18);
  uVar2 = 0;
  for (puVar3 = *(undefined8 **)(*(long *)this + 0x10); puVar3 != puVar1; puVar3 = puVar3 + 1) {
    __filename = (char *)*puVar3;
    if ((__filename != (char *)0x0) && (*(int *)(__filename + 0x90) == 0x13)) {
      this_00 = *(PointerGraph **)this;
      SubgraphNode<dg::pta::PSNode>::isolate((SubgraphNode<dg::pta::PSNode> *)(__filename + 8));
      SubgraphNode<dg::pta::PSNode>::removeAllOperands
                ((SubgraphNode<dg::pta::PSNode> *)(__filename + 8));
      PointerGraph::remove(this_00,__filename);
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2;
}

Assistant:

unsigned PSNoopRemover::run() {
    unsigned removed = 0;
    for (const auto &nd : G->getNodes()) {
        if (!nd)
            continue;

        if (nd->getType() == PSNodeType::NOOP) {
            // this should not break the iterator
            removeNode(G, nd.get());
            ++removed;
        }
    }
    return removed;
}